

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O1

void __thiscall PlayerA::SetPlaybackSpeed(PlayerA *this,double speed)

{
  pointer ppPVar1;
  ulong uVar2;
  
  (this->_config).pbSpeed = speed;
  ppPVar1 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppPVar1) {
    uVar2 = 0;
    do {
      (*ppPVar1[uVar2]->_vptr_PlayerBase[0x11])((this->_config).pbSpeed);
      uVar2 = uVar2 + 1;
      ppPVar1 = (this->_avbPlrs).super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->_avbPlrs).
                                   super__Vector_base<PlayerBase_*,_std::allocator<PlayerBase_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppPVar1 >> 3));
  }
  return;
}

Assistant:

void PlayerA::SetPlaybackSpeed(double speed)
{
	_config.pbSpeed = speed;
	for (size_t curPlr = 0; curPlr < _avbPlrs.size(); curPlr++)
		_avbPlrs[curPlr]->SetPlaybackSpeed(_config.pbSpeed);
	return;
}